

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

Value __thiscall
jsonnet::internal::(anonymous_namespace)::Interpreter::
makeObject<jsonnet::internal::(anonymous_namespace)::HeapComprehensionObject,std::map<jsonnet::internal::Identifier_const*,jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::less<jsonnet::internal::Identifier_const*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*const,jsonnet::internal::(anonymous_namespace)::HeapThunk*>>>,jsonnet::internal::AST_const*,jsonnet::internal::Identifier_const*,std::map<jsonnet::internal::Identifier_const*,jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::less<jsonnet::internal::Identifier_const*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*const,jsonnet::internal::(anonymous_namespace)::HeapThunk*>>>>
          (Interpreter *this,
          map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
          *args,AST *args_1,Identifier *args_2,
          map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
          *args_3)

{
  undefined8 uVar1;
  Interpreter IVar2;
  _Rb_tree_node_base *p_Var3;
  HeapEntity *pHVar4;
  anon_union_8_3_4e909c26_for_v aVar5;
  anon_union_8_3_4e909c26_for_v extraout_RDX;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Value VVar8;
  HeapComprehensionObject *local_38;
  
  VVar8._0_8_ = (HeapComprehensionObject *)operator_new(0x80);
  anon_unknown_0::HeapComprehensionObject::HeapComprehensionObject
            (VVar8._0_8_,args,args_1,args_2,args_3);
  local_38 = VVar8._0_8_;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
               *)(this + 0x18),(value_type *)&local_38);
  IVar2 = this[0x10];
  ((VVar8._0_8_)->super_HeapLeafObject).super_HeapObject.super_HeapEntity.mark =
       (GarbageCollectionMark)IVar2;
  pHVar4 = (HeapEntity *)(*(long *)(this + 0x20) - *(long *)(this + 0x18) >> 3);
  *(HeapEntity **)(this + 0x38) = pHVar4;
  aVar5._4_4_ = 0;
  aVar5._0_4_ = *(uint *)this;
  if ((aVar5.h < pHVar4) &&
     (auVar6._8_4_ = (int)(*(long *)(this + 0x20) - *(long *)(this + 0x18) >> 0x23),
     auVar6._0_8_ = pHVar4, auVar6._12_4_ = 0x45300000, uVar1 = *(undefined8 *)(this + 0x30),
     auVar7._8_4_ = (int)((ulong)uVar1 >> 0x20), auVar7._0_8_ = uVar1, auVar7._12_4_ = 0x45300000,
     ((auVar7._8_8_ - 1.9342813113834067e+25) +
     ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * *(double *)(this + 8) <
     (auVar6._8_8_ - 1.9342813113834067e+25) +
     ((double)CONCAT44(0x43300000,(int)pHVar4) - 4503599627370496.0))) {
    anon_unknown_0::Heap::markFrom((Heap *)(ulong)(byte)IVar2,(HeapEntity *)VVar8._0_8_);
    anon_unknown_0::Stack::mark(*(Stack **)(this + 0x60),*(Heap **)(this + 0x68));
    if (((byte)this[0x40] & 0x10) != 0) {
      anon_unknown_0::Heap::markFrom
                ((Heap *)(ulong)*(uint *)(this + 0x10),*(HeapEntity **)(this + 0x48));
    }
    for (p_Var3 = *(_Rb_tree_node_base **)(this + 0xe0);
        p_Var3 != (_Rb_tree_node_base *)(this + 0xd0);
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      if (*(HeapEntity **)(*(long *)(p_Var3 + 3) + 0x40) != (HeapEntity *)0x0) {
        anon_unknown_0::Heap::markFrom
                  ((Heap *)(ulong)*(uint *)(this + 0x10),
                   *(HeapEntity **)(*(long *)(p_Var3 + 3) + 0x40));
      }
    }
    for (p_Var3 = *(_Rb_tree_node_base **)(this + 0x1b0);
        p_Var3 != (_Rb_tree_node_base *)(this + 0x1a0);
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      anon_unknown_0::Heap::markFrom
                ((Heap *)(ulong)*(uint *)(this + 0x10),*(HeapEntity **)(p_Var3 + 2));
    }
    anon_unknown_0::Heap::sweep((Heap *)this);
    aVar5 = extraout_RDX;
  }
  VVar8.v.h = aVar5.h;
  return VVar8;
}

Assistant:

Value makeObject(Args... args)
    {
        Value r;
        r.t = Value::OBJECT;
        r.v.h = makeHeap<T>(args...);
        return r;
    }